

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(TranslateToFuzzReader *this,Function *func)

{
  Expression **ppEVar1;
  pointer pTVar2;
  ReFinalize local_320;
  undefined1 auStack_1b8 [8];
  Fixer fixer;
  
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->wasm;
  fixer.seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&fixer.seen;
  auStack_1b8 = (undefined1  [8])0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep = (Expression **)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  expressionStack.fixed._M_elems[9] = (Expression *)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.currFunction = (Function *)0x0;
  fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
  super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.currModule = (Module *)0x0;
  fixer.seen._M_t._M_impl._0_4_ = 0;
  fixer.seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fixer.seen._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  fixer.seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  fixer.wasm = (Module *)this;
  fixer.seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       fixer.seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
            ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)auStack_1b8,
             ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan,
             &func->body);
  if (((long)fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
             super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
             super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
             super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
             super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.fixed._M_elems
             [9].currp >> 4) +
      (long)fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
            super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
            super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep != 0) {
    do {
      if ((pointer)fixer.
                   super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                   super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                   super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
          super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
          super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
            super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
            super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<Fixer, wasm::UnifiedExpressionVisitor<Fixer>>::Task, 10>::back() [T = wasm::Walker<Fixer, wasm::UnifiedExpressionVisitor<Fixer>>::Task, N = 10]"
                       );
        }
        pTVar2 = (pointer)((long)(&fixer.
                                   super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                   .
                                   super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                 + -1) + 0xd0 +
                          (long)fixer.
                                super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                .
                                super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                .super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                                replacep * 0x10);
      }
      else {
        pTVar2 = fixer.
                 super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                 super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                 super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      ppEVar1 = pTVar2->currp;
      if ((pointer)fixer.
                   super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                   super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                   super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
          super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
          super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
            super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
            super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<Fixer, wasm::UnifiedExpressionVisitor<Fixer>>::Task, 10>::pop_back() [T = wasm::Walker<Fixer, wasm::UnifiedExpressionVisitor<Fixer>>::Task, N = 10]"
                       );
        }
        fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
        super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
        super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep =
             (Expression **)
             ((long)fixer.
                    super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                    .super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                    super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep + -1)
        ;
      }
      else {
        fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
        super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
        super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
             super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
             super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_1b8 = (undefined1  [8])ppEVar1;
      if (*ppEVar1 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Fixer, wasm::UnifiedExpressionVisitor<Fixer>>::walk(Expression *&) [SubType = Fixer, VisitorType = wasm::UnifiedExpressionVisitor<Fixer>]"
                     );
      }
      (*pTVar2->func)((Fixer *)auStack_1b8,ppEVar1);
    } while (((long)fixer.
                    super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                    .super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                    super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.flexible
                    .
                    super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)fixer.
                    super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                    .super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                    super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.fixed.
                    _M_elems[9].currp >> 4) +
             (long)fixer.
                   super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                   super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                   super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep != 0);
  }
  ReFinalize::ReFinalize(&local_320);
  local_320.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
       this->wasm;
  local_320.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction =
       func;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
            (&local_320.
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
             &func->body);
  local_320.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction =
       (Function *)0x0;
  local_320.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
       (Module *)0x0;
  local_320.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)&PTR__ReFinalize_002086e0;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_320.breakTypes._M_h);
  if (local_320.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.stack.
      flexible.
      super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.
                    super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                    .
                    super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                    .
                    super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_320.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .
                          super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .
                          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .
                          super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .
                          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Pass::~Pass((Pass *)&local_320);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&fixer.parent);
  if (fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
      expressionStack.fixed._M_elems[9] != (Expression *)0x0) {
    operator_delete(fixer.
                    super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                    .expressionStack.fixed._M_elems[9],
                    (long)fixer.
                          super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                          .expressionStack.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)fixer.
                          super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                          .expressionStack.fixed._M_elems[9]);
  }
  if (fixer.super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
      super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
      super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(fixer.
                    super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                    .super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                    super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.fixed.
                    _M_elems[9].currp,
                    (long)fixer.
                          super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                          .super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                          super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)fixer.
                          super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                          .super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                          super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::fixAfterChanges(Function* func) {
  struct Fixer
    : public ExpressionStackWalker<Fixer, UnifiedExpressionVisitor<Fixer>> {
    Module& wasm;
    TranslateToFuzzReader& parent;

    Fixer(Module& wasm, TranslateToFuzzReader& parent)
      : wasm(wasm), parent(parent) {}

    // Track seen names to find duplication, which is invalid.
    std::set<Name> seen;

    void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (seen.count(name)) {
            replace();
          } else {
            seen.insert(name);
          }
        }
      });
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          replaceIfInvalid(name);
        }
      });
    }

    void replaceIfInvalid(Name target) {
      if (!hasBreakTarget(target)) {
        // There is no valid parent, replace with something trivially safe.
        replace();
      }
    }

    void replace() { replaceCurrent(parent.makeTrivial(getCurrent()->type)); }

    bool hasBreakTarget(Name name) {
      // The break must be on top.
      assert(!expressionStack.empty());
      if (expressionStack.size() < 2) {
        // There must be a scope for this break to be valid.
        return false;
      }
      Index i = expressionStack.size() - 2;
      while (1) {
        auto* curr = expressionStack[i];
        bool has = false;
        BranchUtils::operateOnScopeNameDefs(curr, [&](Name& def) {
          if (def == name) {
            has = true;
          }
        });
        if (has) {
          return true;
        }
        if (i == 0) {
          return false;
        }
        i--;
      }
    }

    void visitRethrow(Rethrow* curr) {
      if (!isValidRethrow(curr->target)) {
        replace();
      }
    }

    bool isValidRethrow(Name target) {
      // The rethrow must be on top.
      assert(!expressionStack.empty());
      assert(expressionStack.back()->is<Rethrow>());
      if (expressionStack.size() < 2) {
        // There must be a try for this rethrow to be valid.
        return false;
      }
      Index i = expressionStack.size() - 2;
      while (1) {
        auto* curr = expressionStack[i];
        if (auto* tryy = curr->dynCast<Try>()) {
          // The rethrow must target a try, and must be nested in a catch of
          // that try (not the body). Look at the child above us to check, when
          // we find the proper try.
          if (tryy->name == target) {
            if (i + 1 >= expressionStack.size()) {
              return false;
            }
            auto* child = expressionStack[i + 1];
            return child != tryy->body;
          }
        }
        if (i == 0) {
          // We never found our try.
          return false;
        }
        i--;
      }
    }
  };
  Fixer fixer(wasm, *this);
  fixer.walk(func->body);

  // Refinalize at the end, after labels are all fixed up.
  ReFinalize().walkFunctionInModule(func, &wasm);
}